

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::deleteTrack(MidiFile *this,int aTrack)

{
  pointer ppMVar1;
  MidiEventList *this_00;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  ppMVar1 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
  if (((iVar3 != 1) && (-1 < aTrack)) && (aTrack < iVar3)) {
    uVar2 = (ulong)(uint)aTrack;
    this_00 = ppMVar1[uVar2];
    if (this_00 != (MidiEventList *)0x0) {
      MidiEventList::~MidiEventList(this_00);
      operator_delete(this_00);
    }
    uVar4 = iVar3 - 1;
    if (aTrack < (int)uVar4) {
      do {
        ppMVar1 = (this->m_events).
                  super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppMVar1[uVar2] = ppMVar1[uVar2 + 1];
        aTrack = aTrack + 1;
        uVar2 = uVar2 + 1;
      } while (aTrack < (int)uVar4);
    }
    (this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar4] = (MidiEventList *)0x0;
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
              (&this->m_events,(ulong)uVar4);
    return;
  }
  return;
}

Assistant:

int MidiFile::getNumTracks(void) const {
	return getTrackCount();
}